

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O1

int Kit_TruthToGia2(Gia_Man_t *pMan,uint *pTruth0,uint *pTruth1,int nVars,Vec_Int_t *vMemory,
                   Vec_Int_t *vLeaves,int fHash)

{
  int iVar1;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_00;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = (Vec_Int_t *)malloc(0x10);
    vMemory_00->nCap = 0;
    vMemory_00->nSize = 0;
    vMemory_00->pArray = (int *)0x0;
    pGraph = Kit_TruthToGraph2(pTruth0,pTruth1,nVars,vMemory_00);
    if (vMemory_00->pArray != (int *)0x0) {
      free(vMemory_00->pArray);
      vMemory_00->pArray = (int *)0x0;
    }
    if (vMemory_00 != (Vec_Int_t *)0x0) {
      free(vMemory_00);
    }
  }
  else {
    pGraph = Kit_TruthToGraph2(pTruth0,pTruth1,nVars,vMemory);
  }
  if (pGraph == (Kit_Graph_t *)0x0) {
    puts("Kit_TruthToGia2(): Converting truth table to AIG has failed for function:");
    Kit_DsdPrintFromTruth(pTruth0,nVars);
    putchar(10);
    Kit_DsdPrintFromTruth(pTruth1,nVars);
    putchar(10);
  }
  iVar1 = Kit_GraphToGia(pMan,pGraph,vLeaves,fHash);
  Kit_GraphFree(pGraph);
  return iVar1;
}

Assistant:

int Kit_TruthToGia2( Gia_Man_t * pMan, unsigned * pTruth0, unsigned * pTruth1, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash )
{
    int iLit;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph2( pTruth0, pTruth1, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph2( pTruth0, pTruth1, nVars, vMemory );
    if ( pGraph == NULL )
    {
        printf( "Kit_TruthToGia2(): Converting truth table to AIG has failed for function:\n" );
        Kit_DsdPrintFromTruth( pTruth0, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pTruth1, nVars ); printf( "\n" );
    }
    // derive the AIG for the decomposition tree
    iLit = Kit_GraphToGia( pMan, pGraph, vLeaves, fHash );
    Kit_GraphFree( pGraph );
    return iLit;
}